

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

void canvas_done_popup(_glist *x,t_float which,t_float xpos,t_float ypos)

{
  int iVar1;
  t_propertiesfn p_Var2;
  t_gotfn p_Var3;
  t_symbol *ptVar4;
  char *pcVar5;
  size_t sVar6;
  t_atom *a;
  _glist *x_00;
  _glist *in_RSI;
  _class *c;
  char *__dest;
  int y2;
  int x2;
  int y1;
  int x1;
  char namebuf [1000];
  
  x_00 = (_glist *)x->gl_list;
  if (x_00 != (_glist *)0x0) {
    do {
      in_RSI = x_00;
      iVar1 = canvas_hitbox(x,(t_gobj *)x_00,(int)xpos,(int)ypos,&x1,&y1,&x2,&y2);
      if (iVar1 != 0) {
        if ((which != 0.0) || (NAN(which))) {
          if ((which != 1.0) || (NAN(which))) {
            c = (x_00->gl_obj).te_g.g_pd;
            if (c == canvas_class) {
              iVar1 = canvas_isabstraction(x_00);
              if (iVar1 != 0) {
                iVar1 = binbuf_getnatom((x_00->gl_obj).te_binbuf);
                a = binbuf_getvec((x_00->gl_obj).te_binbuf);
                if (iVar1 < 1) {
                  return;
                }
                atom_string(a,namebuf,1000);
                pcVar5 = strrchr(namebuf,0x2f);
                __dest = pcVar5 + 1;
                if (pcVar5 == (char *)0x0) {
                  __dest = namebuf;
                }
                ptVar4 = canvas_getdir(x_00);
                pcVar5 = ptVar4->s_name;
                goto LAB_00144a62;
              }
              c = (x_00->gl_obj).te_g.g_pd;
            }
            pcVar5 = class_gethelpname(c);
            __dest = namebuf;
            strncpy(__dest,pcVar5,999);
            namebuf[999] = '\0';
            pcVar5 = class_gethelpdir((x_00->gl_obj).te_g.g_pd);
LAB_00144a62:
            sVar6 = strlen(namebuf);
            if ((sVar6 < 4) || (iVar1 = strcmp(namebuf + (sVar6 - 3),".pd"), iVar1 != 0)) {
              sVar6 = strlen(namebuf);
              builtin_strncpy(namebuf + sVar6,".pd",4);
            }
            open_via_helppath(__dest,pcVar5);
            return;
          }
          in_RSI = (_glist *)gensym("menu-open");
          p_Var3 = zgetfn((t_pd *)x_00,(t_symbol *)in_RSI);
          if (p_Var3 != (t_gotfn)0x0) {
            ptVar4 = gensym("menu-open");
            pd_vmess((t_pd *)x_00,ptVar4,"");
            return;
          }
        }
        else {
          p_Var2 = class_getpropertiesfn((x_00->gl_obj).te_g.g_pd);
          if (p_Var2 != (t_propertiesfn)0x0) {
            p_Var2 = class_getpropertiesfn((x_00->gl_obj).te_g.g_pd);
            (*p_Var2)((t_gobj *)x_00,x);
            return;
          }
        }
      }
      x_00 = (_glist *)(x_00->gl_obj).te_g.g_next;
    } while (x_00 != (_glist *)0x0);
  }
  if ((which == 0.0) && (!NAN(which))) {
    canvas_properties((t_gobj *)x,in_RSI);
    return;
  }
  if ((which == 2.0) && (!NAN(which))) {
    ptVar4 = canvas_getdir(x);
    open_via_helppath("intro.pd",ptVar4->s_name);
    return;
  }
  return;
}

Assistant:

static void canvas_done_popup(t_canvas *x, t_float which,
    t_float xpos, t_float ypos)
{
    char namebuf[MAXPDSTRING], *basenamep;
    t_gobj *y;
    for (y = x->gl_list; y; y = y->g_next)
    {
        int x1, y1, x2, y2;
        if (canvas_hitbox(x, y, xpos, ypos, &x1, &y1, &x2, &y2))
        {
            if (which == 0)     /* properties */
            {
                if (!class_getpropertiesfn(pd_class(&y->g_pd)))
                    continue;
                (*class_getpropertiesfn(pd_class(&y->g_pd)))(y, x);
                return;
            }
            else if (which == 1)    /* open */
            {
                if (!zgetfn(&y->g_pd, gensym("menu-open")))
                    continue;
                vmess(&y->g_pd, gensym("menu-open"), "");
                return;
            }
            else    /* help */
            {
                const char *dir;
                if (pd_class(&y->g_pd) == canvas_class &&
                    canvas_isabstraction((t_canvas *)y))
                {
                    t_object *ob = (t_object *)y;
                    int ac = binbuf_getnatom(ob->te_binbuf);
                    t_atom *av = binbuf_getvec(ob->te_binbuf);
                    if (ac < 1)
                        return;
                    atom_string(av, namebuf, MAXPDSTRING);

                        /* strip dir from name : */
                    basenamep = strrchr(namebuf, '/');
#ifdef _WIN32
                    if (!basenamep)
                        basenamep = strrchr(namebuf, '\\');
#endif
                    if (!basenamep)
                        basenamep = namebuf;
                    else basenamep++;   /* strip last '/' */

                    dir = canvas_getdir((t_canvas *)y)->s_name;
                }
                else
                {
                    strncpy(namebuf, class_gethelpname(pd_class(&y->g_pd)),
                        MAXPDSTRING-1);
                    namebuf[MAXPDSTRING-1] = 0;
                    dir = class_gethelpdir(pd_class(&y->g_pd));
                    basenamep = namebuf;
                }
                if (strlen(namebuf) < 4 ||
                    strcmp(namebuf + strlen(namebuf) - 3, ".pd"))
                        strcat(namebuf, ".pd");
                open_via_helppath(basenamep, dir);
                return;
            }
        }
    }
    if (which == 0)
        canvas_properties(&x->gl_gobj, 0);
    else if (which == 2)
        open_via_helppath("intro.pd", canvas_getdir((t_canvas *)x)->s_name);
}